

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack18_16(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x3ffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x12;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0xf) << 0xe | *puVar1;
  out[2] = *puVar2 >> 4 & 0x3ffff;
  puVar1 = out + 3;
  *puVar1 = *puVar2 >> 0x16;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 0xff) << 10 | *puVar1;
  out[4] = *puVar2 >> 8 & 0x3ffff;
  puVar1 = out + 5;
  *puVar1 = *puVar2 >> 0x1a;
  puVar2 = in + 3;
  *puVar1 = (*puVar2 & 0xfff) << 6 | *puVar1;
  out[6] = *puVar2 >> 0xc & 0x3ffff;
  puVar1 = out + 7;
  *puVar1 = *puVar2 >> 0x1e;
  *puVar1 = (in[4] & 0xffff) << 2 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[4] >> 0x10;
  puVar2 = in + 5;
  *puVar1 = (*puVar2 & 3) << 0x10 | *puVar1;
  out[9] = *puVar2 >> 2 & 0x3ffff;
  puVar1 = out + 10;
  *puVar1 = *puVar2 >> 0x14;
  puVar2 = in + 6;
  *puVar1 = (*puVar2 & 0x3f) << 0xc | *puVar1;
  out[0xb] = *puVar2 >> 6 & 0x3ffff;
  puVar1 = out + 0xc;
  *puVar1 = *puVar2 >> 0x18;
  puVar2 = in + 7;
  *puVar1 = (*puVar2 & 0x3ff) << 8 | *puVar1;
  out[0xd] = *puVar2 >> 10 & 0x3ffff;
  puVar1 = out + 0xe;
  *puVar1 = *puVar2 >> 0x1c;
  *puVar1 = (in[8] & 0x3fff) << 4 | *puVar1;
  out[0xf] = in[8] >> 0xe;
  return in + 9;
}

Assistant:

const uint32_t *__fastunpack18_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 4)) << (18 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 18);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 8)) << (18 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 18);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 12)) << (18 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 18);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 16)) << (18 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 2)) << (18 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 18);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 6)) << (18 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 18);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 10)) << (18 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 18);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 14)) << (18 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  out++;

  return in;
}